

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_16x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  long lVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int8_t *piVar17;
  int iVar18;
  undefined1 *puVar19;
  long lVar20;
  int32_t *piVar21;
  undefined1 (*pauVar22) [16];
  ulong *puVar23;
  uint uVar24;
  long lVar25;
  ulong *puVar26;
  int32_t *piVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i in [256];
  longlong local_1038 [30];
  undefined1 local_f48 [144];
  undefined1 local_eb8 [3720];
  
  piVar17 = av1_fwd_txfm_shift_ls[0x11];
  bVar32 = tx_type < 0x10;
  uVar24 = 0xbeaf >> (tx_type & 0x1f);
  uVar28 = 0x7f1f >> (tx_type & 0x1f);
  lVar20 = (long)stride;
  pauVar22 = (undefined1 (*) [16])local_f48;
  lVar25 = lVar20 * 2;
  lVar30 = lVar20 * 4;
  lVar2 = lVar20 * 6;
  uVar29 = 0xfffffffffffffffc;
  uVar31 = 0;
  puVar26 = (ulong *)input;
  do {
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x11];
    if ((uVar24 & 1) == 0 && bVar32) {
      *(ulong *)pauVar22[-0xf] = puVar26[3];
      *(undefined8 *)(pauVar22[-0xf] + 8) = 0;
      *(ulong *)pauVar22[-0xe] = puVar26[2];
      *(undefined8 *)(pauVar22[-0xe] + 8) = 0;
      *(ulong *)pauVar22[-0xd] = puVar26[1];
      *(undefined8 *)(pauVar22[-0xd] + 8) = 0;
      puVar23 = puVar26;
    }
    else {
      *(ulong *)pauVar22[-0xf] = *puVar26;
      *(undefined8 *)(pauVar22[-0xf] + 8) = 0;
      *(ulong *)pauVar22[-0xe] = puVar26[1];
      *(undefined8 *)(pauVar22[-0xe] + 8) = 0;
      *(ulong *)pauVar22[-0xd] = puVar26[2];
      *(undefined8 *)(pauVar22[-0xd] + 8) = 0;
      puVar23 = (ulong *)(input + uVar31 * lVar20 + 0xc);
    }
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *puVar23;
    pauVar22[-0xc] = auVar33;
    if ((uVar28 & 1) == 0 && bVar32) {
      auVar33 = pshuflw(auVar33,pauVar22[-0xf],0x1b);
      pauVar22[-0xf] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-0xe],0x1b);
      pauVar22[-0xe] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-0xd],0x1b);
      pauVar22[-0xd] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-0xc],0x1b);
      pauVar22[-0xc] = auVar33;
    }
    auVar33 = pmovsxwd(auVar33,*(undefined8 *)pauVar22[-0xf]);
    auVar36 = pmovsxwd(in_XMM1,*(undefined8 *)pauVar22[-0xe]);
    auVar40 = pmovsxwd(in_XMM2,*(undefined8 *)pauVar22[-0xd]);
    auVar43 = pmovsxwd(in_XMM3,*(undefined8 *)pauVar22[-0xc]);
    *(int *)pauVar22[-0xf] = auVar33._0_4_ << iVar18;
    *(int *)(pauVar22[-0xf] + 4) = auVar33._4_4_;
    *(int *)(pauVar22[-0xf] + 8) = auVar33._8_4_;
    *(int *)(pauVar22[-0xf] + 0xc) = auVar33._12_4_;
    auVar37._0_4_ = auVar36._0_4_ << iVar18;
    auVar37._4_4_ = auVar36._4_4_;
    auVar37._8_4_ = auVar36._8_4_;
    auVar37._12_4_ = auVar36._12_4_;
    pauVar22[-0xe] = auVar37;
    auVar36._0_4_ = auVar40._0_4_ << iVar18;
    auVar36._4_4_ = auVar40._4_4_;
    auVar36._8_4_ = auVar40._8_4_;
    auVar36._12_4_ = auVar40._12_4_;
    auVar40._0_4_ = auVar43._0_4_ << iVar18;
    auVar40._4_4_ = auVar43._4_4_;
    auVar40._8_4_ = auVar43._8_4_;
    auVar40._12_4_ = auVar43._12_4_;
    pauVar22[-0xd] = auVar36;
    pauVar22[-0xc] = auVar40;
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x11];
    if ((uVar24 & 1) == 0 && bVar32) {
      puVar23 = (ulong *)((long)puVar26 + lVar25);
      *(undefined8 *)pauVar22[-0xb] = *(undefined8 *)((long)puVar26 + lVar25 + 0x18);
      *(undefined8 *)(pauVar22[-0xb] + 8) = 0;
      *(undefined8 *)pauVar22[-10] = *(undefined8 *)((long)puVar26 + lVar25 + 0x10);
      *(undefined8 *)(pauVar22[-10] + 8) = 0;
      *(undefined8 *)pauVar22[-9] = *(undefined8 *)((long)puVar26 + lVar25 + 8);
      *(undefined8 *)(pauVar22[-9] + 8) = 0;
    }
    else {
      *(undefined8 *)pauVar22[-0xb] = *(undefined8 *)((long)puVar26 + lVar25);
      *(undefined8 *)(pauVar22[-0xb] + 8) = 0;
      *(undefined8 *)pauVar22[-10] = *(undefined8 *)((long)puVar26 + lVar25 + 8);
      *(undefined8 *)(pauVar22[-10] + 8) = 0;
      *(undefined8 *)pauVar22[-9] = *(undefined8 *)((long)puVar26 + lVar25 + 0x10);
      *(undefined8 *)(pauVar22[-9] + 8) = 0;
      puVar23 = (ulong *)(input + (uVar31 | 1) * lVar20 + 0xc);
    }
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *puVar23;
    pauVar22[-8] = auVar43;
    if ((uVar28 & 1) == 0 && bVar32) {
      auVar33 = pshuflw(auVar43,pauVar22[-0xb],0x1b);
      pauVar22[-0xb] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-10],0x1b);
      pauVar22[-10] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-9],0x1b);
      pauVar22[-9] = auVar33;
      auVar43 = pshuflw(auVar33,pauVar22[-8],0x1b);
      pauVar22[-8] = auVar43;
    }
    auVar33 = pmovsxwd(auVar43,*(undefined8 *)pauVar22[-0xb]);
    auVar37 = pmovsxwd(auVar37,*(undefined8 *)pauVar22[-10]);
    auVar36 = pmovsxwd(auVar36,*(undefined8 *)pauVar22[-9]);
    auVar40 = pmovsxwd(auVar40,*(undefined8 *)pauVar22[-8]);
    *(int *)pauVar22[-0xb] = auVar33._0_4_ << iVar18;
    *(int *)(pauVar22[-0xb] + 4) = auVar33._4_4_;
    *(int *)(pauVar22[-0xb] + 8) = auVar33._8_4_;
    *(int *)(pauVar22[-0xb] + 0xc) = auVar33._12_4_;
    auVar38._0_4_ = auVar37._0_4_ << iVar18;
    auVar38._4_4_ = auVar37._4_4_;
    auVar38._8_4_ = auVar37._8_4_;
    auVar38._12_4_ = auVar37._12_4_;
    pauVar22[-10] = auVar38;
    auVar41._0_4_ = auVar36._0_4_ << iVar18;
    auVar41._4_4_ = auVar36._4_4_;
    auVar41._8_4_ = auVar36._8_4_;
    auVar41._12_4_ = auVar36._12_4_;
    auVar44._0_4_ = auVar40._0_4_ << iVar18;
    auVar44._4_4_ = auVar40._4_4_;
    auVar44._8_4_ = auVar40._8_4_;
    auVar44._12_4_ = auVar40._12_4_;
    pauVar22[-9] = auVar41;
    pauVar22[-8] = auVar44;
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x11];
    if ((uVar24 & 1) == 0 && bVar32) {
      puVar23 = (ulong *)((long)puVar26 + lVar30);
      *(undefined8 *)pauVar22[-7] = *(undefined8 *)((long)puVar26 + lVar30 + 0x18);
      *(undefined8 *)(pauVar22[-7] + 8) = 0;
      *(undefined8 *)pauVar22[-6] = *(undefined8 *)((long)puVar26 + lVar30 + 0x10);
      *(undefined8 *)(pauVar22[-6] + 8) = 0;
      *(undefined8 *)pauVar22[-5] = *(undefined8 *)((long)puVar26 + lVar30 + 8);
      *(undefined8 *)(pauVar22[-5] + 8) = 0;
    }
    else {
      *(undefined8 *)pauVar22[-7] = *(undefined8 *)((long)puVar26 + lVar30);
      *(undefined8 *)(pauVar22[-7] + 8) = 0;
      *(undefined8 *)pauVar22[-6] = *(undefined8 *)((long)puVar26 + lVar30 + 8);
      *(undefined8 *)(pauVar22[-6] + 8) = 0;
      *(undefined8 *)pauVar22[-5] = *(undefined8 *)((long)puVar26 + lVar30 + 0x10);
      *(undefined8 *)(pauVar22[-5] + 8) = 0;
      puVar23 = (ulong *)(input + (uVar31 | 2) * lVar20 + 0xc);
    }
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *puVar23;
    pauVar22[-4] = auVar34;
    if ((uVar28 & 1) == 0 && bVar32) {
      auVar33 = pshuflw(auVar34,pauVar22[-7],0x1b);
      pauVar22[-7] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-6],0x1b);
      pauVar22[-6] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-5],0x1b);
      pauVar22[-5] = auVar33;
      auVar34 = pshuflw(auVar33,pauVar22[-4],0x1b);
      pauVar22[-4] = auVar34;
    }
    auVar33 = pmovsxwd(auVar34,*(undefined8 *)pauVar22[-7]);
    auVar36 = pmovsxwd(auVar38,*(undefined8 *)pauVar22[-6]);
    auVar37 = pmovsxwd(auVar41,*(undefined8 *)pauVar22[-5]);
    auVar40 = pmovsxwd(auVar44,*(undefined8 *)pauVar22[-4]);
    *(int *)pauVar22[-7] = auVar33._0_4_ << iVar18;
    *(int *)(pauVar22[-7] + 4) = auVar33._4_4_;
    *(int *)(pauVar22[-7] + 8) = auVar33._8_4_;
    *(int *)(pauVar22[-7] + 0xc) = auVar33._12_4_;
    auVar39._0_4_ = auVar36._0_4_ << iVar18;
    auVar39._4_4_ = auVar36._4_4_;
    auVar39._8_4_ = auVar36._8_4_;
    auVar39._12_4_ = auVar36._12_4_;
    pauVar22[-6] = auVar39;
    auVar42._0_4_ = auVar37._0_4_ << iVar18;
    auVar42._4_4_ = auVar37._4_4_;
    auVar42._8_4_ = auVar37._8_4_;
    auVar42._12_4_ = auVar37._12_4_;
    auVar45._0_4_ = auVar40._0_4_ << iVar18;
    auVar45._4_4_ = auVar40._4_4_;
    auVar45._8_4_ = auVar40._8_4_;
    auVar45._12_4_ = auVar40._12_4_;
    pauVar22[-5] = auVar42;
    pauVar22[-4] = auVar45;
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x11];
    if ((uVar24 & 1) == 0 && bVar32) {
      puVar23 = (ulong *)((long)puVar26 + lVar2);
      *(undefined8 *)pauVar22[-3] = *(undefined8 *)((long)puVar26 + lVar2 + 0x18);
      *(undefined8 *)(pauVar22[-3] + 8) = 0;
      *(undefined8 *)pauVar22[-2] = *(undefined8 *)((long)puVar26 + lVar2 + 0x10);
      *(undefined8 *)(pauVar22[-2] + 8) = 0;
      *(undefined8 *)pauVar22[-1] = *(undefined8 *)((long)puVar26 + lVar2 + 8);
      *(undefined8 *)(pauVar22[-1] + 8) = 0;
    }
    else {
      *(undefined8 *)pauVar22[-3] = *(undefined8 *)((long)puVar26 + lVar2);
      *(undefined8 *)(pauVar22[-3] + 8) = 0;
      *(undefined8 *)pauVar22[-2] = *(undefined8 *)((long)puVar26 + lVar2 + 8);
      *(undefined8 *)(pauVar22[-2] + 8) = 0;
      *(undefined8 *)pauVar22[-1] = *(undefined8 *)((long)puVar26 + lVar2 + 0x10);
      *(undefined8 *)(pauVar22[-1] + 8) = 0;
      puVar23 = (ulong *)(input + (uVar31 | 3) * lVar20 + 0xc);
    }
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *puVar23;
    *pauVar22 = auVar35;
    if ((uVar28 & 1) == 0 && bVar32) {
      auVar33 = pshuflw(auVar35,pauVar22[-3],0x1b);
      pauVar22[-3] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-2],0x1b);
      pauVar22[-2] = auVar33;
      auVar33 = pshuflw(auVar33,pauVar22[-1],0x1b);
      pauVar22[-1] = auVar33;
      auVar35 = pshuflw(auVar33,*pauVar22,0x1b);
      *pauVar22 = auVar35;
    }
    auVar33 = pmovsxwd(auVar35,*(undefined8 *)pauVar22[-3]);
    auVar36 = pmovsxwd(auVar39,*(undefined8 *)pauVar22[-2]);
    auVar37 = pmovsxwd(auVar42,*(undefined8 *)pauVar22[-1]);
    auVar40 = pmovsxwd(auVar45,*(undefined8 *)*pauVar22);
    *(int *)pauVar22[-3] = auVar33._0_4_ << iVar18;
    *(int *)(pauVar22[-3] + 4) = auVar33._4_4_;
    *(int *)(pauVar22[-3] + 8) = auVar33._8_4_;
    *(int *)(pauVar22[-3] + 0xc) = auVar33._12_4_;
    in_XMM1._0_4_ = auVar36._0_4_ << iVar18;
    in_XMM1._4_4_ = auVar36._4_4_;
    in_XMM1._8_4_ = auVar36._8_4_;
    in_XMM1._12_4_ = auVar36._12_4_;
    pauVar22[-2] = in_XMM1;
    in_XMM2._0_4_ = auVar37._0_4_ << iVar18;
    in_XMM2._4_4_ = auVar37._4_4_;
    in_XMM2._8_4_ = auVar37._8_4_;
    in_XMM2._12_4_ = auVar37._12_4_;
    pauVar22[-1] = in_XMM2;
    in_XMM3._0_4_ = auVar40._0_4_ << iVar18;
    in_XMM3._4_4_ = auVar40._4_4_;
    in_XMM3._8_4_ = auVar40._8_4_;
    in_XMM3._12_4_ = auVar40._12_4_;
    *pauVar22 = in_XMM3;
    uVar31 = uVar31 + 4;
    pauVar22 = pauVar22 + 0x10;
    uVar29 = uVar29 + 4;
    puVar26 = puVar26 + lVar20;
  } while (uVar29 < 0x3c);
  lVar30 = 0;
  do {
    av1_fdct64_sse4_1((__m128i *)((long)local_1038 + lVar30),(__m128i *)((long)coeff + lVar30),'\r',
                      4,4);
    lVar30 = lVar30 + 0x10;
  } while (lVar30 != 0x40);
  col_txfm_16x16_rounding((__m128i *)coeff,-(int)piVar17[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x100),-(int)piVar17[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x200),-(int)piVar17[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x300),-(int)piVar17[1]);
  puVar19 = local_eb8;
  piVar21 = coeff + 0x30;
  lVar30 = 0;
  do {
    lVar25 = -0x80;
    piVar27 = piVar21;
    do {
      iVar10 = piVar27[-0x2f];
      iVar11 = piVar27[-0x2e];
      iVar12 = piVar27[-0x2d];
      iVar3 = piVar27[-0x1f];
      iVar4 = piVar27[-0x1e];
      iVar5 = piVar27[-0x1d];
      iVar13 = piVar27[-0x10];
      iVar14 = piVar27[-0xf];
      iVar15 = piVar27[-0xe];
      iVar16 = piVar27[-0xd];
      iVar6 = *piVar27;
      iVar7 = piVar27[1];
      iVar8 = piVar27[2];
      iVar9 = piVar27[3];
      *(ulong *)(puVar19 + lVar25 + -0x100) = CONCAT44(piVar27[-0x20],piVar27[-0x30]);
      *(ulong *)((long)(puVar19 + lVar25 + -0x100) + 8) = CONCAT44(iVar6,iVar13);
      *(int32_t *)(puVar19 + lVar25 + -0x78) = iVar10;
      *(int32_t *)(puVar19 + lVar25 + -0x74) = iVar3;
      *(int32_t *)(puVar19 + lVar25 + -0x70) = iVar14;
      *(int32_t *)(puVar19 + lVar25 + -0x6c) = iVar7;
      piVar1 = (int32_t *)(puVar19 + lVar25);
      *piVar1 = iVar11;
      piVar1[1] = iVar4;
      piVar1[2] = iVar15;
      piVar1[3] = iVar8;
      *(int32_t *)(puVar19 + lVar25 + 0x88) = iVar12;
      *(int32_t *)(puVar19 + lVar25 + 0x8c) = iVar5;
      *(int32_t *)(puVar19 + lVar25 + 0x90) = iVar16;
      *(int32_t *)(puVar19 + lVar25 + 0x94) = iVar9;
      piVar27 = piVar27 + 0x40;
      lVar25 = lVar25 + 0x10;
    } while (lVar25 != 0);
    lVar30 = lVar30 + 1;
    puVar19 = puVar19 + 0x200;
    piVar21 = piVar21 + 4;
  } while (lVar30 != 4);
  fdct16x16_sse4_1((__m128i *)local_1038,(__m128i *)coeff,0xc,8);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[256];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X64];
  const int txw_idx = get_txw_idx(TX_16X64);
  const int txh_idx = get_txh_idx(TX_16X64);
  const int txfm_size_col = tx_size_wide[TX_16X64];
  const int txfm_size_row = tx_size_high[TX_16X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const int num_col = txfm_size_col >> 2;
  // col tranform
  for (int i = 0; i < txfm_size_row; i += num_col) {
    load_buffer_4x4(input + (i + 0) * stride, in + (i + 0) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 1) * stride, in + (i + 1) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 2) * stride, in + (i + 2) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 3) * stride, in + (i + 3) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1(in + i, outcoeff128 + i, bitcol, num_col, num_col);
  }

  col_txfm_16x16_rounding(outcoeff128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 64, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 192, -shift[1]);

  transpose_8nx8n(outcoeff128, in, txfm_size_col, 32);
  fdct16x16_sse4_1(in, outcoeff128, bitrow, 8);
  (void)bd;
}